

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

bool EV_OpenPolyDoor(line_t_conflict *line,int polyNum,double speed,DAngle *angle,int delay,
                    double distance,podoortype_t type)

{
  double dVar1;
  long lVar2;
  FPolyObj *poly;
  DPolyAction *pDVar3;
  bool bVar4;
  FPolyMirrorIterator it;
  int local_1fc;
  TAngle<double> local_1e8;
  DObject *pDStack_1e0;
  FPolyMirrorIterator local_1d0;
  
  lVar2 = (long)po_NumPolyobjs;
  local_1d0.CurPoly = polyobjs;
  if (0 < lVar2) {
    do {
      if ((local_1d0.CurPoly)->tag == polyNum) {
        local_1d0.NumUsedPolys = 1;
        local_1d0.UsedPolys[0] = polyNum;
        poly = FPolyMirrorIterator::NextMirror(&local_1d0);
        if (poly == (FPolyObj *)0x0) {
          return false;
        }
        local_1fc = 1;
        bVar4 = false;
        do {
          pDVar3 = (poly->specialdata).field_0.p;
          if (pDVar3 != (DPolyAction *)0x0) {
            if (((pDVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
              return bVar4;
            }
            (poly->specialdata).field_0.p = (DPolyAction *)0x0;
          }
          if (poly->bBlocked != false) {
            return bVar4;
          }
          if ((type == PODOOR_SWING) && (poly->bHasPortals == '\x02')) {
            return bVar4;
          }
          pDVar3 = (DPolyAction *)
                   M_Malloc_Dbg(0x90,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                ,0x1f9);
          DPolyAction::DPolyAction(pDVar3,poly->tag);
          pDVar3[1].super_DThinker.super_DObject._vptr_DObject = (_func_int **)0x0;
          pDVar3[1].super_DThinker.super_DObject.Class = (PClass *)0x0;
          pDVar3[1].super_DThinker.super_DObject.ObjNext = (DObject *)0x0;
          (pDVar3->super_DThinker).super_DObject._vptr_DObject =
               (_func_int **)&PTR_StaticType_006fee58;
          *(podoortype_t *)&pDVar3[1].super_DThinker.PrevThinker = type;
          *(undefined1 *)((long)&pDVar3[1].super_DThinker.PrevThinker + 4) = 0;
          pDVar3[1].super_DThinker.super_DObject.GCNext = (DObject *)0x0;
          *(undefined8 *)&pDVar3[1].super_DThinker.super_DObject.ObjectFlags = 0;
          pDVar3[1].super_DThinker.NextThinker = (DThinker *)0x0;
          (poly->specialdata).field_0.p = pDVar3;
          if (type == PODOOR_SLIDE) {
            *(int *)((long)&pDVar3[1].super_DThinker.NextThinker + 4) = delay;
            pDVar3->m_Speed = speed;
            *(double *)&pDVar3[1].super_DThinker.super_DObject.ObjectFlags = distance;
            pDVar3->m_Dist = distance;
            pDVar3[1].super_DThinker.super_DObject.GCNext = (DObject *)angle->Degrees;
            TAngle<double>::ToVector(&local_1e8,speed);
            pDVar3[1].super_DThinker.super_DObject.Class = (PClass *)local_1e8.Degrees;
            pDVar3[1].super_DThinker.super_DObject.ObjNext = pDStack_1e0;
            SN_StartSequence(poly,poly->seqType,SEQ_DOOR,0,false);
            angle->Degrees = angle->Degrees + 180.0;
          }
          else if (type == PODOOR_SWING) {
            *(int *)((long)&pDVar3[1].super_DThinker.NextThinker + 4) = delay;
            pDVar3[1].super_DThinker.super_DObject.GCNext = (DObject *)(double)local_1fc;
            pDVar3->m_Speed = (double)local_1fc * speed * 1.40625 * 0.125;
            dVar1 = angle->Degrees;
            *(double *)&pDVar3[1].super_DThinker.super_DObject.ObjectFlags = dVar1;
            pDVar3->m_Dist = dVar1;
            SN_StartSequence(poly,poly->seqType,SEQ_DOOR,0,false);
            local_1fc = -local_1fc;
          }
          poly = FPolyMirrorIterator::NextMirror(&local_1d0);
          bVar4 = true;
        } while (poly != (FPolyObj *)0x0);
        return true;
      }
      lVar2 = lVar2 + -1;
      local_1d0.CurPoly = local_1d0.CurPoly + 1;
    } while (lVar2 != 0);
  }
  Printf("EV_OpenPolyDoor: Invalid polyobj num: %d\n");
  return false;
}

Assistant:

bool EV_OpenPolyDoor(line_t *line, int polyNum, double speed, DAngle angle, int delay, double distance, podoortype_t type)
{
	DPolyDoor *pd = NULL;
	FPolyObj *poly;
	int swingdir = 1;	// ADD:  PODOOR_SWINGL, PODOOR_SWINGR

	if ((poly = PO_GetPolyobj(polyNum)) == NULL)
	{
		Printf("EV_OpenPolyDoor: Invalid polyobj num: %d\n", polyNum);
		return false;
	}
	FPolyMirrorIterator it(poly);

	while ((poly = it.NextMirror()) != NULL)
	{
		if ((poly->specialdata != NULL || poly->bBlocked))
		{ // poly is already moving
			break;
		}
		if (poly->bHasPortals == 2 && type == PODOOR_SWING)
		{
			// cannot do rotations on linked polyportals.
			break;
		}

		pd = new DPolyDoor(poly->tag, type);
		poly->specialdata = pd;
		if (type == PODOOR_SLIDE)
		{
			pd->m_WaitTics = delay;
			pd->m_Speed = speed;
			pd->m_Dist = pd->m_TotalDist = distance; // Distance
			pd->m_Direction = angle;
			pd->m_Speedv = angle.ToVector(speed);
			SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);
			angle += 180.;	// reverse the angle
		}
		else if (type == PODOOR_SWING)
		{
			pd->m_WaitTics = delay;
			pd->m_Direction.Degrees = swingdir; 
			pd->m_Speed = (speed*swingdir*(90. / 64)) / 8;
			pd->m_Dist = pd->m_TotalDist = angle.Degrees;
			SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);
			swingdir = -swingdir;	// reverse the direction
		}

	}
	return pd != NULL;	// Return true if something started moving.
}